

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void DivisionHelper<unsigned_short,_long,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,long *u,unsigned_short *result)

{
  ulong uVar1;
  unsigned_short uVar2;
  ulong uVar3;
  
  uVar1 = *u;
  if (uVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  uVar3 = (ulong)*t;
  if (uVar3 != 0) {
    if (0 < (long)uVar1) {
      uVar2 = (unsigned_short)(uVar3 / uVar1);
      goto LAB_00113c62;
    }
    if (-uVar1 < uVar3 || -uVar3 == uVar1) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  uVar2 = 0;
LAB_00113c62:
  *result = uVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }